

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

Test * __thiscall
testing::internal::TestFactoryImpl<osqp::(anonymous_namespace)::TwoDimensionalQpTest_Solves_Test>::
CreateTest(TestFactoryImpl<osqp::(anonymous_namespace)::TwoDimensionalQpTest_Solves_Test> *this)

{
  TwoDimensionalQpTest *this_00;
  
  this_00 = (TwoDimensionalQpTest *)operator_new(0x18);
  osqp::anon_unknown_0::TwoDimensionalQpTest::TwoDimensionalQpTest(this_00);
  (this_00->super_Test)._vptr_Test = (_func_int **)&PTR__TwoDimensionalQpTest_001ee718;
  return &this_00->super_Test;
}

Assistant:

Test* CreateTest() override { return new TestClass; }